

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject **block;
  GCObject *pGVar2;
  GCObject **ppGVar3;
  ulong uVar4;
  long lVar5;
  GCObject *pGVar6;
  long lVar7;
  ulong uVar8;
  
  if (L->l_G->gcstate != '\x02') {
    if (newsize < -1) {
      luaM_toobig(L);
    }
    uVar8 = 0;
    ppGVar3 = (GCObject **)luaM_realloc_(L,(void *)0x0,0,(long)newsize * 8);
    pgVar1 = L->l_G;
    uVar4 = 0;
    if (0 < newsize) {
      uVar4 = (ulong)(uint)newsize;
    }
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      ppGVar3[uVar8] = (GCObject *)0x0;
    }
    lVar5 = 0;
    while( true ) {
      lVar7 = (long)(pgVar1->strt).size;
      block = (pgVar1->strt).hash;
      if (lVar7 <= lVar5) break;
      pGVar6 = block[lVar5];
      while (pGVar6 != (GCObject *)0x0) {
        pGVar2 = (pGVar6->gch).next;
        uVar4 = (long)*(int *)((long)pGVar6 + 0xc) & (long)newsize - 1U;
        (pGVar6->gch).next = ppGVar3[uVar4];
        ppGVar3[uVar4] = pGVar6;
        pGVar6 = pGVar2;
      }
      lVar5 = lVar5 + 1;
    }
    luaM_realloc_(L,block,lVar7 << 3,0);
    (pgVar1->strt).size = newsize;
    (pgVar1->strt).hash = ppGVar3;
  }
  return;
}

Assistant:

static void luaS_resize(lua_State*L,int newsize){
GCObject**newhash;
stringtable*tb;
int i;
if(G(L)->gcstate==2)
return;
newhash=luaM_newvector(L,newsize,GCObject*);
tb=&G(L)->strt;
for(i=0;i<newsize;i++)newhash[i]=NULL;
for(i=0;i<tb->size;i++){
GCObject*p=tb->hash[i];
while(p){
GCObject*next=p->gch.next;
unsigned int h=gco2ts(p)->hash;
int h1=lmod(h,newsize);
p->gch.next=newhash[h1];
newhash[h1]=p;
p=next;
}
}
luaM_freearray(L,tb->hash,tb->size,TString*);
tb->size=newsize;
tb->hash=newhash;
}